

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O1

void __thiscall
TPZFrontMatrix<std::complex<long_double>,_TPZStackEqnStorage<std::complex<long_double>_>,_TPZFrontSym<std::complex<long_double>_>_>
::TPZFrontMatrix(TPZFrontMatrix<std::complex<long_double>,_TPZStackEqnStorage<std::complex<long_double>_>,_TPZFrontSym<std::complex<long_double>_>_>
                 *this)

{
  (this->super_TPZAbstractFrontMatrix<std::complex<long_double>_>).
  super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
       = (_func_int **)0x0;
  (this->super_TPZAbstractFrontMatrix<std::complex<long_double>_>).
  super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow = 0;
  *(undefined8 *)
   ((long)&(this->super_TPZAbstractFrontMatrix<std::complex<long_double>_>).
           super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow + 2) = 0;
  *(undefined8 *)
   ((long)&(this->super_TPZAbstractFrontMatrix<std::complex<long_double>_>).
           super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fCol + 2) = 0;
  (this->super_TPZAbstractFrontMatrix<std::complex<long_double>_>).
  super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
       = (_func_int **)&PTR__TPZFrontMatrix_019ab1f8;
  TPZStackEqnStorage<std::complex<long_double>_>::TPZStackEqnStorage(&this->fStorage);
  TPZFrontSym<std::complex<long_double>_>::TPZFrontSym(&this->fFront);
  (this->fNumElConnected)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
  (this->fNumElConnected).fStore = (int *)0x0;
  (this->fNumElConnected).fNElements = 0;
  (this->fNumElConnected).fNAlloc = 0;
  (this->fNumElConnectedBackup)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
  (this->fNumElConnectedBackup).fStore = (int *)0x0;
  (this->fNumElConnectedBackup).fNElements = 0;
  (this->fNumElConnectedBackup).fNAlloc = 0;
  TPZFrontSym<std::complex<long_double>_>::Reset(&this->fFront,0);
  TPZStackEqnStorage<std::complex<long_double>_>::Reset(&this->fStorage);
  TPZVec<int>::Resize(&this->fNumElConnected,0);
  TPZVec<int>::Resize(&this->fNumElConnectedBackup,0);
  this->fLastDecomposed = -1;
  this->fNumEq = 0;
  return;
}

Assistant:

TPZFrontMatrix<TVar,store, front>::TPZFrontMatrix() : TPZRegisterClassId(&TPZFrontMatrix::ClassId),
TPZAbstractFrontMatrix<TVar>()
{
	fFront.Reset();
	fStorage.Reset();
	fNumElConnected.Resize(0);
	fNumElConnectedBackup.Resize(0);
	fLastDecomposed = -1;
	fNumEq=0;
}